

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O1

string * __thiscall
MismatchedTokenException::getErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,MismatchedTokenException *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  undefined8 *puVar3;
  size_type *psVar4;
  long *plVar5;
  ulong *puVar6;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  vector<int,_std::allocator<int>_> elems;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(this->mismatchType) {
  case 1:
    local_d8 = paVar1;
    tokenName_abi_cxx11_(&local_b0,this,this->expecting);
    puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x20de16);
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_c0 = *plVar2;
      uStack_b8 = puVar3[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar2;
      local_d0 = (long *)*puVar3;
    }
    local_c8 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_f8.field_2._M_allocated_capacity = *puVar6;
      local_f8.field_2._8_8_ = puVar3[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *puVar6;
      local_f8._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_f8._M_string_length = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_f8,(ulong)(this->tokenText)._M_dataplus._M_p);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_118.field_2._M_allocated_capacity = *psVar4;
      local_118.field_2._8_8_ = plVar2[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar4;
      local_118._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_118._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_138.field_2._M_allocated_capacity = *puVar6;
      local_138.field_2._8_8_ = puVar3[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *puVar6;
      local_138._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_138._M_string_length = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    local_50.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return __return_storage_ptr__;
    }
    break;
  case 2:
    tokenName_abi_cxx11_(&local_f8,this,this->expecting);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x20de21);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_118.field_2._M_allocated_capacity = *psVar4;
      local_118.field_2._8_8_ = plVar2[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar4;
      local_118._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_118._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_138.field_2._M_allocated_capacity = *puVar6;
      local_138.field_2._8_8_ = puVar3[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *puVar6;
      local_138._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_138._M_string_length = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    local_50.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
      return __return_storage_ptr__;
    }
    break;
  case 3:
    local_d8 = paVar1;
    tokenName_abi_cxx11_(&local_50,this,this->expecting);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x20de49);
    local_70 = &local_60;
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_60 = *plVar5;
      lStack_58 = plVar2[3];
    }
    else {
      local_60 = *plVar5;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    puVar6 = (ulong *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_b0.field_2._M_allocated_capacity = *puVar6;
      local_b0.field_2._8_8_ = plVar2[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar6;
      local_b0._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_b0._M_string_length = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    tokenName_abi_cxx11_(&local_90,this,this->upper);
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar8 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_90._M_string_length + local_b0._M_string_length) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar8 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_90._M_string_length + local_b0._M_string_length) goto LAB_001ec1ee;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
    }
    else {
LAB_001ec1ee:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
    }
    local_d0 = &local_c0;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_c0 = *plVar2;
      uStack_b8 = puVar3[3];
    }
    else {
      local_c0 = *plVar2;
      local_d0 = (long *)*puVar3;
    }
    local_c8 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_f8.field_2._M_allocated_capacity = *puVar6;
      local_f8.field_2._8_8_ = puVar3[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *puVar6;
      local_f8._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_f8._M_string_length = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_f8,(ulong)(this->tokenText)._M_dataplus._M_p);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_118.field_2._M_allocated_capacity = *psVar4;
      local_118.field_2._8_8_ = plVar2[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar4;
      local_118._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_118._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_138.field_2._M_allocated_capacity = *puVar6;
      local_138.field_2._8_8_ = puVar3[3];
    }
    else {
      local_138.field_2._M_allocated_capacity = *puVar6;
      local_138._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_138._M_string_length = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
    goto LAB_001ec78c;
  case 4:
    local_d8 = paVar1;
    tokenName_abi_cxx11_(&local_50,this,this->expecting);
    puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x20de64);
    local_70 = &local_60;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_60 = *plVar2;
      lStack_58 = puVar3[3];
    }
    else {
      local_60 = *plVar2;
      local_70 = (long *)*puVar3;
    }
    local_68 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_b0.field_2._M_allocated_capacity = *puVar6;
      local_b0.field_2._8_8_ = puVar3[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar6;
      local_b0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_b0._M_string_length = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    tokenName_abi_cxx11_(&local_90,this,this->upper);
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar8 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_90._M_string_length + local_b0._M_string_length) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar8 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_90._M_string_length + local_b0._M_string_length) goto LAB_001ec299;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
    }
    else {
LAB_001ec299:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
    }
    local_d0 = &local_c0;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_c0 = *plVar2;
      uStack_b8 = puVar3[3];
    }
    else {
      local_c0 = *plVar2;
      local_d0 = (long *)*puVar3;
    }
    local_c8 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_f8.field_2._M_allocated_capacity = *puVar6;
      local_f8.field_2._8_8_ = puVar3[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *puVar6;
      local_f8._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_f8._M_string_length = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_f8,(ulong)(this->tokenText)._M_dataplus._M_p);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar4 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_118.field_2._M_allocated_capacity = *psVar4;
      local_118.field_2._8_8_ = puVar3[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar4;
      local_118._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_118._M_string_length = puVar3[1];
    *puVar3 = psVar4;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_138.field_2._M_allocated_capacity = *puVar6;
      local_138.field_2._8_8_ = puVar3[3];
    }
    else {
      local_138.field_2._M_allocated_capacity = *puVar6;
      local_138._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_138._M_string_length = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
LAB_001ec78c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
    break;
  case 5:
  case 6:
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_d8 = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"expecting ","");
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_118.field_2._M_allocated_capacity = *psVar4;
      local_118.field_2._8_8_ = plVar2[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar4;
      local_118._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_118._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_118);
    paVar1 = &local_138.field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_138.field_2._M_allocated_capacity = *psVar4;
      local_138.field_2._8_8_ = plVar2[3];
      local_138._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar4;
      local_138._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_138._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    BitSet::toArray((vector<int,_std::allocator<int>_> *)&local_f8,&this->set);
    if (0 < (int)(local_f8._M_string_length - (long)local_f8._M_dataplus._M_p >> 2)) {
      lVar7 = 0;
      do {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        tokenName_abi_cxx11_(&local_138,this,*(int *)(local_f8._M_dataplus._M_p + lVar7 * 4));
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (int)(local_f8._M_string_length - (long)local_f8._M_dataplus._M_p >> 2));
    }
    std::operator+(&local_118,"), found \'",&this->tokenText);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_118);
    puVar6 = (ulong *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_138.field_2._M_allocated_capacity = *puVar6;
      local_138.field_2._8_8_ = plVar2[3];
      local_138._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_138.field_2._M_allocated_capacity = *puVar6;
      local_138._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_138._M_string_length = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return __return_storage_ptr__;
    }
    uVar9 = local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p;
    local_50._M_dataplus._M_p = local_f8._M_dataplus._M_p;
    goto LAB_001ec869;
  default:
    ANTLRException::getMessage_abi_cxx11_(&local_138,(ANTLRException *)this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
    local_50.field_2._M_allocated_capacity = local_138.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) {
      return __return_storage_ptr__;
    }
  }
  uVar9 = local_50.field_2._M_allocated_capacity + 1;
LAB_001ec869:
  operator_delete(local_50._M_dataplus._M_p,uVar9);
  return __return_storage_ptr__;
}

Assistant:

std::string MismatchedTokenException::getErrorMessage() const
{
	std::string s;
	switch (mismatchType) {
	case TOKEN:
		s += "expecting " + tokenName(expecting) + ", found '" + tokenText + "'";
		break;
	case NOT_TOKEN:
		s += "expecting anything but " + tokenName(expecting) + "; got it anyway";
		break;
	case RANGE:
		s += "expecting token in range: " + tokenName(expecting) + ".." + tokenName(upper) + ", found '" + tokenText + "'";
		break;
	case NOT_RANGE:
		s += "expecting token NOT in range: " + tokenName(expecting) + ".." + tokenName(upper) + ", found '" + tokenText + "'";
		break;
	case SET:
	case NOT_SET:
		{
			s += std::string("expecting ") + (mismatchType == NOT_SET ? "NOT " : "") + "one of (";
			std::vector<int> elems = set.toArray();
			for (int i = 0; i < (int) elems.size(); i++)
			{
				s += " ";
				s += tokenName(elems[i]);
			}
			s += "), found '" + tokenText + "'";
		}
		break;
	default:
		s = ParserException::getMessage();
		break;
	}
	return s;
}